

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x03'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x03_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *paVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *this_00;
  string *psVar2;
  string *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  MetricType in_stack_ffffffffffffff3c;
  _Alloc_hider in_stack_ffffffffffffff40;
  undefined1 local_60 [96];
  
  paVar1 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)(local_60 + 0x20);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  this_00 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             *)local_60;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff40._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  psVar2 = (string *)&stack0xffffffffffffff40;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  array(this_00,paVar1);
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)3>::metric_t<3ul>
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x03_> *)
             in_stack_ffffffffffffff40._M_p,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
             psVar2,this_00);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  ~array(in_RDI);
  std::__cxx11::string::~string(in_RDX);
  std::__cxx11::string::~string(in_RDX);
  in_RDI->_M_elems[0]._M_dataplus._M_p = (pointer)&PTR__basic_dynamic_counter_0032b418;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}